

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::parseAreaLight(SemanticParser *this,SP *in)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  int iVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  char *pcVar6;
  ostream *poVar7;
  SP SVar8;
  allocator local_69;
  string local_68;
  SP diffuse;
  vec2f v;
  
  if ((in_RDX._M_pi)->_vptr__Sp_counted_base != (_func_int **)0x0) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((in_RDX._M_pi)->_vptr__Sp_counted_base + 7),"diffuse");
    if (bVar4) {
      pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
      std::__cxx11::string::string((string *)&local_68,"L",(allocator *)&diffuse);
      bVar4 = syntactic::ParamSet::hasParam2f((ParamSet *)(pp_Var1 + 1),&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (bVar4) {
        std::make_shared<pbrt::DiffuseAreaLightBB>();
        pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        std::__cxx11::string::string((string *)&local_68,"L",&local_69);
        syntactic::ParamSet::getParam2f((ParamSet *)(pp_Var1 + 1),&v.x,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        (diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        temperature = v.x;
        (diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        scale = v.y;
        pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        std::__cxx11::string::string((string *)&local_68,"nsamples",&local_69);
        iVar5 = syntactic::ParamSet::getParam1i((ParamSet *)(pp_Var1 + 1),&local_68,1);
        (diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        nSamples = iVar5;
      }
      else {
        pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        std::__cxx11::string::string((string *)&local_68,"L",(allocator *)&diffuse);
        bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)(pp_Var1 + 1),&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (!bVar4) {
          poVar7 = (ostream *)&std::cout;
          pcVar6 = 
          "Warning: diffuse area light, but no \'L\' parameter, or L is neither two (blackbody) nor three (rgba) floats?! Ignoring."
          ;
          goto LAB_00149b10;
        }
        std::make_shared<pbrt::DiffuseAreaLightRGB>();
        peVar2 = diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        std::__cxx11::string::string((string *)&local_68,"L",(allocator *)&v);
        syntactic::ParamSet::getParam3f((ParamSet *)(pp_Var1 + 1),&peVar2->temperature,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        std::__cxx11::string::string((string *)&local_68,"nsamples",(allocator *)&v);
        iVar5 = syntactic::ParamSet::getParam1i((ParamSet *)(pp_Var1 + 1),&local_68,1);
        *(int *)&(diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->field_0x24 = iVar5;
      }
      std::__cxx11::string::~string((string *)&local_68);
      _Var3 = diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var3._M_pi;
      diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&diffuse.super___shared_ptr<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      in_RDX._M_pi = extraout_RDX_00;
      goto LAB_00149c0e;
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"Warning: unknown area light type \'");
    poVar7 = std::operator<<(poVar7,(string *)((in_RDX._M_pi)->_vptr__Sp_counted_base + 7));
    pcVar6 = "\'.";
LAB_00149b10:
    poVar7 = std::operator<<(poVar7,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar7);
    in_RDX._M_pi = extraout_RDX;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00149c0e:
  SVar8.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar8.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar8.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AreaLight::SP SemanticParser::parseAreaLight(pbrt::syntactic::AreaLightSource::SP in)
  {
    if (!in)
      return AreaLight::SP();

    if (in->type == "diffuse") {
      /*! parsing here is a bit more tricky, because the L parameter
          can be either an RGB, or a blackbody. Since the latter has
          two floats to the former's three floats we'll simply switch
          based on parameter count here .... */
      if (in->hasParam2f("L")) {
        DiffuseAreaLightBB::SP diffuse = std::make_shared<DiffuseAreaLightBB>();
        vec2f v;
        in->getParam2f(&v.x,"L");
        diffuse->temperature = v.x;
        diffuse->scale       = v.y;
        diffuse->nSamples = in->getParam1i("nsamples", 1);
        return diffuse;
      } else if (in->hasParam3f("L")) {
        DiffuseAreaLightRGB::SP diffuse = std::make_shared<DiffuseAreaLightRGB>();
        in->getParam3f(&diffuse->L.x,"L");
        diffuse->nSamples = in->getParam1i("nsamples", 1);
        return diffuse;
      } else {
        std::cout << "Warning: diffuse area light, but no 'L' parameter, or L is neither two (blackbody) nor three (rgba) floats?! Ignoring." << std::endl;
        return AreaLight::SP();
      }
      // auto L_it = in->param.find("L");
      // if (L_it == in->param.end()) {
      //   std::cout << "Warning: diffuse area light, but no 'L' parameter?! Ignoring." << std::endl;
      //   return AreaLight::SP();
      // }

      // syntactic::Param::SP param = L_it->second;
      // if (param->getType() == "blackbody") {
      //   // not blackbody - assume it's RGB
      //   DiffuseAreaLightBB::SP diffuse = std::make_shared<DiffuseAreaLightBB>();
        
      //   in->getParam3f(&diffuse->blackBody.x,"L");
      //   return diffuse;
      // } else {
      //   // not blackbody - assume it's RGB
      //   DiffuseAreaLightRGB::SP diffuse = std::make_shared<DiffuseAreaLightRGB>();
      //   in->getParam3f(&diffuse->blackBody.x,"L");
      //   return diffuse;
      // }
      
    }

    std::cout << "Warning: unknown area light type '" << in->type << "'." << std::endl;
    return AreaLight::SP();
  }